

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  int iVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong *puVar21;
  ulong uVar22;
  undefined4 uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  float *vertices;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar57;
  float fVar60;
  float fVar61;
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar77;
  uint uVar79;
  uint uVar80;
  undefined1 auVar78 [16];
  uint uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_bf8;
  ulong local_b30;
  RTCFilterFunctionNArguments local_ad0;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar57 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar63._4_4_ = fVar57;
  auVar63._0_4_ = fVar57;
  auVar63._8_4_ = fVar57;
  auVar63._12_4_ = fVar57;
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar67._4_4_ = fVar60;
  auVar67._0_4_ = fVar60;
  auVar67._8_4_ = fVar60;
  auVar67._12_4_ = fVar60;
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar69._4_4_ = fVar61;
  auVar69._0_4_ = fVar61;
  auVar69._8_4_ = fVar61;
  auVar69._12_4_ = fVar61;
  fVar57 = fVar57 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar61 = fVar61 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a70._8_4_ = 0x80000000;
  local_a70._0_8_ = 0x8000000080000000;
  local_a70._12_4_ = 0x80000000;
  auVar70._0_8_ = CONCAT44(fVar57,fVar57) ^ 0x8000000080000000;
  auVar70._8_4_ = -fVar57;
  auVar70._12_4_ = -fVar57;
  auVar74._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  auVar74._8_4_ = -fVar60;
  auVar74._12_4_ = -fVar60;
  iVar17 = (tray->tnear).field_0.i[k];
  auVar78._4_4_ = iVar17;
  auVar78._0_4_ = iVar17;
  auVar78._8_4_ = iVar17;
  auVar78._12_4_ = iVar17;
  iVar17 = (tray->tfar).field_0.i[k];
  auVar82._4_4_ = iVar17;
  auVar82._0_4_ = iVar17;
  auVar82._8_4_ = iVar17;
  auVar82._12_4_ = iVar17;
  auVar84._0_8_ = CONCAT44(fVar61,fVar61) ^ 0x8000000080000000;
  auVar84._8_4_ = -fVar61;
  auVar84._12_4_ = -fVar61;
  iVar17 = 1 << ((uint)k & 0x1f);
  auVar50._4_4_ = iVar17;
  auVar50._0_4_ = iVar17;
  auVar50._8_4_ = iVar17;
  auVar50._12_4_ = iVar17;
  auVar50._16_4_ = iVar17;
  auVar50._20_4_ = iVar17;
  auVar50._24_4_ = iVar17;
  auVar50._28_4_ = iVar17;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar50 = vpand_avx2(auVar50,auVar6);
  local_940 = vpcmpeqd_avx2(auVar50,auVar6);
  local_bf8 = local_7f8;
  do {
    puVar21 = local_bf8;
    if (puVar21 == &local_800) break;
    local_bf8 = puVar21 + -1;
    uVar36 = puVar21[-1];
    do {
      if ((uVar36 & 8) == 0) {
        uVar18 = uVar36 & 0xfffffffffffffff0;
        uVar23 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar41._4_4_ = uVar23;
        auVar41._0_4_ = uVar23;
        auVar41._8_4_ = uVar23;
        auVar41._12_4_ = uVar23;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar24),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar24));
        auVar42 = vfmadd213ps_fma(auVar42,auVar63,auVar70);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar27),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar27));
        auVar47 = vfmadd213ps_fma(auVar47,auVar67,auVar74);
        auVar42 = vpmaxsd_avx(auVar42,auVar47);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + uVar29),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + uVar29));
        auVar47 = vfmadd213ps_fma(auVar47,auVar69,auVar84);
        auVar47 = vpmaxsd_avx(auVar47,auVar78);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar24 ^ 0x10)),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar24 ^ 0x10)));
        auVar42 = vpmaxsd_avx(auVar42,auVar47);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar27 ^ 0x10)),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar27 ^ 0x10)));
        auVar43 = vfmadd213ps_fma(auVar43,auVar63,auVar70);
        auVar47 = vfmadd213ps_fma(auVar47,auVar67,auVar74);
        auVar47 = vpminsd_avx(auVar43,auVar47);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x80 + (uVar29 ^ 0x10)),auVar41,
                                  *(undefined1 (*) [16])(uVar18 + 0x20 + (uVar29 ^ 0x10)));
        auVar43 = vfmadd213ps_fma(auVar43,auVar69,auVar84);
        auVar43 = vpminsd_avx(auVar43,auVar82);
        auVar47 = vpminsd_avx(auVar47,auVar43);
        if (((uint)uVar36 & 7) == 6) {
          auVar47 = vcmpps_avx(auVar42,auVar47,2);
          auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar41,2);
          auVar43 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
          auVar42 = vandps_avx(auVar42,auVar43);
          auVar42 = vandps_avx(auVar42,auVar47);
        }
        else {
          auVar42 = vcmpps_avx(auVar42,auVar47,2);
        }
        auVar42 = vpslld_avx(auVar42,0x1f);
        uVar23 = vmovmskps_avx(auVar42);
        local_b30 = CONCAT44((int)(local_b30 >> 0x20),uVar23);
      }
      if ((uVar36 & 8) == 0) {
        if (local_b30 == 0) {
          uVar77 = 4;
        }
        else {
          uVar18 = uVar36 & 0xfffffffffffffff0;
          lVar7 = 0;
          for (uVar36 = local_b30; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar7 = lVar7 + 1;
          }
          uVar77 = 0;
          uVar36 = *(ulong *)(uVar18 + lVar7 * 8);
          for (uVar19 = local_b30 - 1 & local_b30; uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
            *local_bf8 = uVar36;
            local_bf8 = local_bf8 + 1;
            lVar7 = 0;
            for (uVar36 = uVar19; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar7 = lVar7 + 1;
            }
            uVar36 = *(ulong *)(uVar18 + lVar7 * 8);
          }
        }
      }
      else {
        uVar77 = 6;
      }
    } while (uVar77 == 0);
    if (uVar77 == 6) {
      uVar18 = (ulong)((uint)uVar36 & 0xf);
      uVar77 = 0;
      uVar19 = uVar18 - 8;
      bVar39 = uVar18 != 8;
      if (bVar39) {
        uVar36 = uVar36 & 0xfffffffffffffff0;
        uVar18 = 0;
        do {
          lVar20 = uVar18 * 0x50;
          pSVar3 = context->scene;
          pGVar4 = (pSVar3->geometries).items[*(uint *)(uVar36 + 0x30 + lVar20)].ptr;
          fVar57 = (pGVar4->time_range).lower;
          fVar57 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar57) /
                   ((pGVar4->time_range).upper - fVar57));
          auVar42 = vroundss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),9);
          auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar54 = vmaxss_avx(ZEXT816(0),auVar42);
          lVar25 = (long)(int)auVar54._0_4_ * 0x38;
          uVar26 = (ulong)*(uint *)(uVar36 + 4 + lVar20);
          lVar7 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar25);
          lVar25 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar25);
          auVar42 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar36 + lVar20) * 4);
          uVar38 = (ulong)*(uint *)(uVar36 + 0x10 + lVar20);
          auVar47 = *(undefined1 (*) [16])(lVar7 + uVar38 * 4);
          uVar22 = (ulong)*(uint *)(uVar36 + 0x20 + lVar20);
          auVar53 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
          auVar43 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
          uVar28 = (ulong)*(uint *)(uVar36 + 0x14 + lVar20);
          auVar41 = *(undefined1 (*) [16])(lVar7 + uVar28 * 4);
          uVar30 = (ulong)*(uint *)(uVar36 + 0x24 + lVar20);
          auVar64 = *(undefined1 (*) [16])(lVar7 + uVar30 * 4);
          uVar35 = (ulong)*(uint *)(uVar36 + 8 + lVar20);
          auVar51 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
          uVar33 = (ulong)*(uint *)(uVar36 + 0x18 + lVar20);
          auVar59 = *(undefined1 (*) [16])(lVar7 + uVar33 * 4);
          uVar31 = (ulong)*(uint *)(uVar36 + 0x28 + lVar20);
          auVar52 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
          uVar37 = (ulong)*(uint *)(uVar36 + 0xc + lVar20);
          auVar49 = *(undefined1 (*) [16])(lVar7 + uVar37 * 4);
          uVar34 = (ulong)*(uint *)(uVar36 + 0x1c + lVar20);
          auVar44 = *(undefined1 (*) [16])(lVar7 + uVar34 * 4);
          uVar32 = (ulong)*(uint *)(uVar36 + 0x2c + lVar20);
          auVar45 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar36 + lVar20) * 4);
          auVar68 = *(undefined1 (*) [16])(lVar25 + uVar38 * 4);
          fVar57 = fVar57 - auVar54._0_4_;
          auVar54 = vunpcklps_avx(auVar42,auVar51);
          auVar51 = vunpckhps_avx(auVar42,auVar51);
          auVar58 = vunpcklps_avx(auVar43,auVar49);
          auVar43 = vunpckhps_avx(auVar43,auVar49);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar26 * 4);
          local_a50 = vunpcklps_avx(auVar51,auVar43);
          auVar49 = vunpcklps_avx(auVar54,auVar58);
          auVar51 = vunpckhps_avx(auVar54,auVar58);
          auVar54 = vunpcklps_avx(auVar47,auVar59);
          auVar43 = vunpckhps_avx(auVar47,auVar59);
          auVar59 = vunpcklps_avx(auVar41,auVar44);
          auVar41 = vunpckhps_avx(auVar41,auVar44);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
          local_a40 = vunpcklps_avx(auVar43,auVar41);
          auVar44 = vunpcklps_avx(auVar54,auVar59);
          local_a60 = vunpckhps_avx(auVar54,auVar59);
          auVar54 = vunpcklps_avx(auVar53,auVar52);
          auVar41 = vunpckhps_avx(auVar53,auVar52);
          auVar52 = vunpcklps_avx(auVar64,auVar45);
          auVar59 = vunpckhps_avx(auVar64,auVar45);
          auVar43 = *(undefined1 (*) [16])(lVar25 + uVar37 * 4);
          auVar45 = vunpcklps_avx(auVar41,auVar59);
          auVar58 = vunpcklps_avx(auVar54,auVar52);
          local_a30 = vunpckhps_avx(auVar54,auVar52);
          auVar41 = vunpcklps_avx(auVar46,auVar47);
          auVar47 = vunpckhps_avx(auVar46,auVar47);
          auVar59 = vunpcklps_avx(auVar42,auVar43);
          auVar43 = vunpckhps_avx(auVar42,auVar43);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar33 * 4);
          auVar52 = vunpcklps_avx(auVar47,auVar43);
          auVar46 = vunpcklps_avx(auVar41,auVar59);
          auVar43 = vunpckhps_avx(auVar41,auVar59);
          auVar59 = vunpcklps_avx(auVar68,auVar42);
          auVar41 = vunpckhps_avx(auVar68,auVar42);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar28 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar34 * 4);
          auVar68 = vunpcklps_avx(auVar42,auVar47);
          auVar42 = vunpckhps_avx(auVar42,auVar47);
          auVar54 = vunpcklps_avx(auVar41,auVar42);
          auVar53 = vunpcklps_avx(auVar59,auVar68);
          auVar41 = vunpckhps_avx(auVar59,auVar68);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar22 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar31 * 4);
          auVar68 = vunpcklps_avx(auVar42,auVar47);
          auVar59 = vunpckhps_avx(auVar42,auVar47);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar30 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar32 * 4);
          auVar64 = vunpcklps_avx(auVar42,auVar47);
          auVar42 = vunpckhps_avx(auVar42,auVar47);
          auVar47 = vunpcklps_avx(auVar59,auVar42);
          auVar59 = vunpcklps_avx(auVar68,auVar64);
          auVar42 = vunpckhps_avx(auVar68,auVar64);
          fVar60 = 1.0 - fVar57;
          auVar86._4_4_ = fVar60;
          auVar86._0_4_ = fVar60;
          auVar86._8_4_ = fVar60;
          auVar86._12_4_ = fVar60;
          auVar68._0_4_ = fVar57 * auVar46._0_4_;
          auVar68._4_4_ = fVar57 * auVar46._4_4_;
          auVar68._8_4_ = fVar57 * auVar46._8_4_;
          auVar68._12_4_ = fVar57 * auVar46._12_4_;
          auVar49 = vfmadd231ps_fma(auVar68,auVar86,auVar49);
          auVar71._0_4_ = fVar57 * auVar43._0_4_;
          auVar71._4_4_ = fVar57 * auVar43._4_4_;
          auVar71._8_4_ = fVar57 * auVar43._8_4_;
          auVar71._12_4_ = fVar57 * auVar43._12_4_;
          auVar46 = vfmadd231ps_fma(auVar71,auVar86,auVar51);
          auVar75._0_4_ = fVar57 * auVar52._0_4_;
          auVar75._4_4_ = fVar57 * auVar52._4_4_;
          auVar75._8_4_ = fVar57 * auVar52._8_4_;
          auVar75._12_4_ = fVar57 * auVar52._12_4_;
          auVar68 = vfmadd231ps_fma(auVar75,auVar86,local_a50);
          auVar43._0_4_ = fVar57 * auVar53._0_4_;
          auVar43._4_4_ = fVar57 * auVar53._4_4_;
          auVar43._8_4_ = fVar57 * auVar53._8_4_;
          auVar43._12_4_ = fVar57 * auVar53._12_4_;
          auVar43 = vfmadd231ps_fma(auVar43,auVar86,auVar44);
          auVar51._0_4_ = fVar57 * auVar41._0_4_;
          auVar51._4_4_ = fVar57 * auVar41._4_4_;
          auVar51._8_4_ = fVar57 * auVar41._8_4_;
          auVar51._12_4_ = fVar57 * auVar41._12_4_;
          auVar41 = vfmadd231ps_fma(auVar51,auVar86,local_a60);
          auVar53._0_4_ = fVar57 * auVar54._0_4_;
          auVar53._4_4_ = fVar57 * auVar54._4_4_;
          auVar53._8_4_ = fVar57 * auVar54._8_4_;
          auVar53._12_4_ = fVar57 * auVar54._12_4_;
          auVar51 = vfmadd231ps_fma(auVar53,auVar86,local_a40);
          puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar20);
          local_a10 = *puVar1;
          uStack_a08 = puVar1[1];
          puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar20);
          auVar64._0_4_ = fVar57 * auVar59._0_4_;
          auVar64._4_4_ = fVar57 * auVar59._4_4_;
          auVar64._8_4_ = fVar57 * auVar59._8_4_;
          auVar64._12_4_ = fVar57 * auVar59._12_4_;
          auVar83._0_4_ = fVar57 * auVar42._0_4_;
          auVar83._4_4_ = fVar57 * auVar42._4_4_;
          auVar83._8_4_ = fVar57 * auVar42._8_4_;
          auVar83._12_4_ = fVar57 * auVar42._12_4_;
          auVar88._0_4_ = fVar57 * auVar47._0_4_;
          auVar88._4_4_ = fVar57 * auVar47._4_4_;
          auVar88._8_4_ = fVar57 * auVar47._8_4_;
          auVar88._12_4_ = fVar57 * auVar47._12_4_;
          auVar59 = vfmadd231ps_fma(auVar64,auVar86,auVar58);
          auVar52 = vfmadd231ps_fma(auVar83,auVar86,local_a30);
          auVar44 = vfmadd231ps_fma(auVar88,auVar86,auVar45);
          local_a20 = *puVar1;
          uStack_a18 = puVar1[1];
          auVar47 = vsubps_avx(auVar49,auVar43);
          auVar42 = vsubps_avx(auVar46,auVar41);
          auVar43 = vsubps_avx(auVar68,auVar51);
          auVar41 = vsubps_avx(auVar59,auVar49);
          auVar51 = vsubps_avx(auVar52,auVar46);
          auVar59 = vsubps_avx(auVar44,auVar68);
          auVar52._0_4_ = auVar42._0_4_ * auVar59._0_4_;
          auVar52._4_4_ = auVar42._4_4_ * auVar59._4_4_;
          auVar52._8_4_ = auVar42._8_4_ * auVar59._8_4_;
          auVar52._12_4_ = auVar42._12_4_ * auVar59._12_4_;
          local_970 = vfmsub231ps_fma(auVar52,auVar51,auVar43);
          auVar58._0_4_ = auVar43._0_4_ * auVar41._0_4_;
          auVar58._4_4_ = auVar43._4_4_ * auVar41._4_4_;
          auVar58._8_4_ = auVar43._8_4_ * auVar41._8_4_;
          auVar58._12_4_ = auVar43._12_4_ * auVar41._12_4_;
          local_960 = vfmsub231ps_fma(auVar58,auVar59,auVar47);
          uVar23 = *(undefined4 *)(ray + k * 4);
          auVar54._4_4_ = uVar23;
          auVar54._0_4_ = uVar23;
          auVar54._8_4_ = uVar23;
          auVar54._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar65._4_4_ = uVar23;
          auVar65._0_4_ = uVar23;
          auVar65._8_4_ = uVar23;
          auVar65._12_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar44._4_4_ = uVar23;
          auVar44._0_4_ = uVar23;
          auVar44._8_4_ = uVar23;
          auVar44._12_4_ = uVar23;
          fVar57 = *(float *)(ray + k * 4 + 0x80);
          auVar87._4_4_ = fVar57;
          auVar87._0_4_ = fVar57;
          auVar87._8_4_ = fVar57;
          auVar87._12_4_ = fVar57;
          auVar52 = vsubps_avx(auVar49,auVar54);
          fVar60 = *(float *)(ray + k * 4 + 0xa0);
          auVar89._4_4_ = fVar60;
          auVar89._0_4_ = fVar60;
          auVar89._8_4_ = fVar60;
          auVar89._12_4_ = fVar60;
          auVar49 = vsubps_avx(auVar46,auVar65);
          fVar61 = *(float *)(ray + k * 4 + 0xc0);
          auVar90._4_4_ = fVar61;
          auVar90._0_4_ = fVar61;
          auVar90._8_4_ = fVar61;
          auVar90._12_4_ = fVar61;
          auVar44 = vsubps_avx(auVar68,auVar44);
          auVar45._0_4_ = fVar57 * auVar49._0_4_;
          auVar45._4_4_ = fVar57 * auVar49._4_4_;
          auVar45._8_4_ = fVar57 * auVar49._8_4_;
          auVar45._12_4_ = fVar57 * auVar49._12_4_;
          auVar45 = vfmsub231ps_fma(auVar45,auVar52,auVar89);
          auVar76._0_4_ = auVar59._0_4_ * auVar45._0_4_;
          auVar76._4_4_ = auVar59._4_4_ * auVar45._4_4_;
          auVar76._8_4_ = auVar59._8_4_ * auVar45._8_4_;
          auVar76._12_4_ = auVar59._12_4_ * auVar45._12_4_;
          auVar46._0_4_ = auVar43._0_4_ * auVar45._0_4_;
          auVar46._4_4_ = auVar43._4_4_ * auVar45._4_4_;
          auVar46._8_4_ = auVar43._8_4_ * auVar45._8_4_;
          auVar46._12_4_ = auVar43._12_4_ * auVar45._12_4_;
          auVar72._0_4_ = fVar61 * auVar52._0_4_;
          auVar72._4_4_ = fVar61 * auVar52._4_4_;
          auVar72._8_4_ = fVar61 * auVar52._8_4_;
          auVar72._12_4_ = fVar61 * auVar52._12_4_;
          auVar59 = vfmsub231ps_fma(auVar72,auVar44,auVar87);
          auVar43 = vfmadd231ps_fma(auVar76,auVar59,auVar51);
          auVar59 = vfmadd231ps_fma(auVar46,auVar42,auVar59);
          auVar73._0_4_ = auVar51._0_4_ * auVar47._0_4_;
          auVar73._4_4_ = auVar51._4_4_ * auVar47._4_4_;
          auVar73._8_4_ = auVar51._8_4_ * auVar47._8_4_;
          auVar73._12_4_ = auVar51._12_4_ * auVar47._12_4_;
          local_950 = vfmsub231ps_fma(auVar73,auVar41,auVar42);
          auVar42._0_4_ = fVar60 * auVar44._0_4_;
          auVar42._4_4_ = fVar60 * auVar44._4_4_;
          auVar42._8_4_ = fVar60 * auVar44._8_4_;
          auVar42._12_4_ = fVar60 * auVar44._12_4_;
          auVar45 = vfmsub231ps_fma(auVar42,auVar49,auVar90);
          auVar85._0_4_ = fVar61 * local_950._0_4_;
          auVar85._4_4_ = fVar61 * local_950._4_4_;
          auVar85._8_4_ = fVar61 * local_950._8_4_;
          auVar85._12_4_ = fVar61 * local_950._12_4_;
          auVar42 = vfmadd231ps_fma(auVar85,local_960,auVar89);
          auVar51 = vfmadd231ps_fma(auVar42,local_970,auVar87);
          auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar41);
          auVar42 = vandps_avx(auVar51,local_a70);
          uVar77 = auVar42._0_4_;
          local_a00._0_4_ = (float)(uVar77 ^ auVar43._0_4_);
          uVar79 = auVar42._4_4_;
          local_a00._4_4_ = (float)(uVar79 ^ auVar43._4_4_);
          uVar80 = auVar42._8_4_;
          local_a00._8_4_ = (float)(uVar80 ^ auVar43._8_4_);
          uVar81 = auVar42._12_4_;
          local_a00._12_4_ = (float)(uVar81 ^ auVar43._12_4_);
          auVar42 = vfmadd231ps_fma(auVar59,auVar47,auVar45);
          local_9f0._0_4_ = (float)(uVar77 ^ auVar42._0_4_);
          local_9f0._4_4_ = (float)(uVar79 ^ auVar42._4_4_);
          local_9f0._8_4_ = (float)(uVar80 ^ auVar42._8_4_);
          local_9f0._12_4_ = (float)(uVar81 ^ auVar42._12_4_);
          auVar43 = ZEXT816(0) << 0x20;
          auVar42 = vcmpps_avx(local_a00,auVar43,5);
          auVar47 = vcmpps_avx(local_9f0,auVar43,5);
          auVar42 = vandps_avx(auVar42,auVar47);
          auVar59._8_4_ = 0x7fffffff;
          auVar59._0_8_ = 0x7fffffff7fffffff;
          auVar59._12_4_ = 0x7fffffff;
          local_9d0 = vandps_avx(auVar51,auVar59);
          auVar47 = vcmpps_avx(auVar51,auVar43,4);
          auVar42 = vandps_avx(auVar47,auVar42);
          auVar47._0_4_ = local_9f0._0_4_ + local_a00._0_4_;
          auVar47._4_4_ = local_9f0._4_4_ + local_a00._4_4_;
          auVar47._8_4_ = local_9f0._8_4_ + local_a00._8_4_;
          auVar47._12_4_ = local_9f0._12_4_ + local_a00._12_4_;
          auVar47 = vcmpps_avx(auVar47,local_9d0,2);
          auVar43 = auVar47 & auVar42;
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            auVar42 = vandps_avx(auVar42,auVar47);
            auVar48._0_4_ = local_950._0_4_ * auVar44._0_4_;
            auVar48._4_4_ = local_950._4_4_ * auVar44._4_4_;
            auVar48._8_4_ = local_950._8_4_ * auVar44._8_4_;
            auVar48._12_4_ = local_950._12_4_ * auVar44._12_4_;
            auVar47 = vfmadd213ps_fma(auVar49,local_960,auVar48);
            auVar47 = vfmadd213ps_fma(auVar52,local_970,auVar47);
            local_9e0._0_4_ = (float)(uVar77 ^ auVar47._0_4_);
            local_9e0._4_4_ = (float)(uVar79 ^ auVar47._4_4_);
            local_9e0._8_4_ = (float)(uVar80 ^ auVar47._8_4_);
            local_9e0._12_4_ = (float)(uVar81 ^ auVar47._12_4_);
            fVar57 = *(float *)(ray + k * 4 + 0x60);
            auVar49._0_4_ = local_9d0._0_4_ * fVar57;
            auVar49._4_4_ = local_9d0._4_4_ * fVar57;
            auVar49._8_4_ = local_9d0._8_4_ * fVar57;
            auVar49._12_4_ = local_9d0._12_4_ * fVar57;
            auVar47 = vcmpps_avx(auVar49,local_9e0,1);
            fVar57 = *(float *)(ray + k * 4 + 0x100);
            auVar66._0_4_ = local_9d0._0_4_ * fVar57;
            auVar66._4_4_ = local_9d0._4_4_ * fVar57;
            auVar66._8_4_ = local_9d0._8_4_ * fVar57;
            auVar66._12_4_ = local_9d0._12_4_ * fVar57;
            auVar43 = vcmpps_avx(local_9e0,auVar66,2);
            auVar47 = vandps_avx(auVar47,auVar43);
            auVar43 = auVar42 & auVar47;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              local_9b0 = vandps_avx(auVar42,auVar47);
              auVar42 = vrcpps_avx(local_9d0);
              auVar55._8_4_ = 0x3f800000;
              auVar55._0_8_ = &DAT_3f8000003f800000;
              auVar55._12_4_ = 0x3f800000;
              auVar47 = vfnmadd213ps_fma(local_9d0,auVar42,auVar55);
              auVar42 = vfmadd132ps_fma(auVar47,auVar42,auVar42);
              fVar57 = auVar42._0_4_;
              fVar60 = auVar42._4_4_;
              fVar61 = auVar42._8_4_;
              fVar62 = auVar42._12_4_;
              local_980[0] = fVar57 * local_9e0._0_4_;
              local_980[1] = fVar60 * local_9e0._4_4_;
              local_980[2] = fVar61 * local_9e0._8_4_;
              local_980[3] = fVar62 * local_9e0._12_4_;
              local_9a0[0] = fVar57 * local_a00._0_4_;
              local_9a0[1] = fVar60 * local_a00._4_4_;
              local_9a0[2] = fVar61 * local_a00._8_4_;
              local_9a0[3] = fVar62 * local_a00._12_4_;
              local_990._0_4_ = fVar57 * local_9f0._0_4_;
              local_990._4_4_ = fVar60 * local_9f0._4_4_;
              local_990._8_4_ = fVar61 * local_9f0._8_4_;
              local_990._12_4_ = fVar62 * local_9f0._12_4_;
              uVar23 = vmovmskps_avx(local_9b0);
              uVar38 = CONCAT44((int)((ulong)lVar7 >> 0x20),uVar23);
              do {
                uVar26 = 0;
                for (uVar22 = uVar38; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar26 = uVar26 + 1;
                }
                uVar77 = *(uint *)((long)&local_a10 + uVar26 * 4);
                pGVar4 = (pSVar3->geometries).items[uVar77].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar38 = uVar38 ^ 1L << (uVar26 & 0x3f);
                  bVar40 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar40 = false;
                }
                else {
                  uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar22 = (ulong)(uint)((int)uVar26 * 4);
                  uVar2 = *(undefined4 *)((long)local_9a0 + uVar22);
                  local_8c0._4_4_ = uVar2;
                  local_8c0._0_4_ = uVar2;
                  local_8c0._8_4_ = uVar2;
                  local_8c0._12_4_ = uVar2;
                  local_8c0._16_4_ = uVar2;
                  local_8c0._20_4_ = uVar2;
                  local_8c0._24_4_ = uVar2;
                  local_8c0._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_990 + uVar22);
                  local_8a0._4_4_ = uVar2;
                  local_8a0._0_4_ = uVar2;
                  local_8a0._8_4_ = uVar2;
                  local_8a0._12_4_ = uVar2;
                  local_8a0._16_4_ = uVar2;
                  local_8a0._20_4_ = uVar2;
                  local_8a0._24_4_ = uVar2;
                  local_8a0._28_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar22);
                  local_ad0.context = context->user;
                  uVar2 = *(undefined4 *)((long)&local_a20 + uVar22);
                  local_880._4_4_ = uVar2;
                  local_880._0_4_ = uVar2;
                  local_880._8_4_ = uVar2;
                  local_880._12_4_ = uVar2;
                  local_880._16_4_ = uVar2;
                  local_880._20_4_ = uVar2;
                  local_880._24_4_ = uVar2;
                  local_880._28_4_ = uVar2;
                  local_920 = *(undefined4 *)(local_970 + uVar22);
                  local_900 = *(undefined4 *)(local_960 + uVar22);
                  local_8e0 = *(undefined4 *)(local_950 + uVar22);
                  local_860._4_4_ = uVar77;
                  local_860._0_4_ = uVar77;
                  local_860._8_4_ = uVar77;
                  local_860._12_4_ = uVar77;
                  local_860._16_4_ = uVar77;
                  local_860._20_4_ = uVar77;
                  local_860._24_4_ = uVar77;
                  local_860._28_4_ = uVar77;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_ad0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_ad0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_aa0 = local_940._0_8_;
                  uStack_a98 = local_940._8_8_;
                  uStack_a90 = local_940._16_8_;
                  uStack_a88 = local_940._24_8_;
                  local_ad0.valid = (int *)&local_aa0;
                  local_ad0.geometryUserPtr = pGVar4->userPtr;
                  local_ad0.hit = (RTCHitN *)&local_920;
                  local_ad0.N = 8;
                  local_ad0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar4->occlusionFilterN)(&local_ad0);
                  }
                  auVar6._8_8_ = uStack_a98;
                  auVar6._0_8_ = local_aa0;
                  auVar6._16_8_ = uStack_a90;
                  auVar6._24_8_ = uStack_a88;
                  auVar6 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
                  auVar50 = _DAT_0205a980 & ~auVar6;
                  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar50 >> 0x7f,0) == '\0') &&
                        (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar50 >> 0xbf,0) == '\0') &&
                      (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar50[0x1f]) {
                    auVar6 = auVar6 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&local_ad0);
                    }
                    auVar16._8_8_ = uStack_a98;
                    auVar16._0_8_ = local_aa0;
                    auVar16._16_8_ = uStack_a90;
                    auVar16._24_8_ = uStack_a88;
                    auVar50 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
                    auVar6 = auVar50 ^ _DAT_0205a980;
                    auVar56._8_4_ = 0xff800000;
                    auVar56._0_8_ = 0xff800000ff800000;
                    auVar56._12_4_ = 0xff800000;
                    auVar56._16_4_ = 0xff800000;
                    auVar56._20_4_ = 0xff800000;
                    auVar56._24_4_ = 0xff800000;
                    auVar56._28_4_ = 0xff800000;
                    auVar50 = vblendvps_avx(auVar56,*(undefined1 (*) [32])(local_ad0.ray + 0x100),
                                            auVar50);
                    *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar50;
                  }
                  bVar14 = (auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar15 = (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar13 = (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar12 = SUB321(auVar6 >> 0x7f,0) == '\0';
                  bVar11 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar10 = SUB321(auVar6 >> 0xbf,0) == '\0';
                  bVar9 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar8 = -1 < auVar6[0x1f];
                  bVar40 = ((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) &&
                           bVar9) && bVar8;
                  if (((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9)
                      && bVar8) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar23;
                    uVar38 = uVar38 ^ 1L << (uVar26 & 0x3f);
                  }
                }
                uVar77 = 0;
                if (!bVar40) {
                  if (bVar39) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar77 = 1;
                  }
                  goto LAB_005e2f83;
                }
              } while (uVar38 != 0);
            }
          }
          uVar77 = 0;
          uVar18 = uVar18 + 1;
          bVar39 = uVar18 < uVar19;
        } while (uVar18 != uVar19);
      }
    }
LAB_005e2f83:
  } while ((uVar77 & 3) == 0);
  return puVar21 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }